

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int flow_set_outgoing_window(FLOW_HANDLE flow,uint32_t outgoing_window_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE outgoing_window_amqp_value;
  FLOW_INSTANCE *flow_instance;
  int result;
  uint32_t outgoing_window_value_local;
  FLOW_HANDLE flow_local;
  
  if (flow == (FLOW_HANDLE)0x0) {
    flow_instance._0_4_ = 0x1816;
  }
  else {
    item_value = amqpvalue_create_uint(outgoing_window_value);
    if (item_value == (AMQP_VALUE)0x0) {
      flow_instance._0_4_ = 0x181e;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(flow->composite_value,3,item_value);
      if (iVar1 == 0) {
        flow_instance._0_4_ = 0;
      }
      else {
        flow_instance._0_4_ = 0x1824;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)flow_instance;
}

Assistant:

int flow_set_outgoing_window(FLOW_HANDLE flow, uint32_t outgoing_window_value)
{
    int result;

    if (flow == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow;
        AMQP_VALUE outgoing_window_amqp_value = amqpvalue_create_uint(outgoing_window_value);
        if (outgoing_window_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(flow_instance->composite_value, 3, outgoing_window_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(outgoing_window_amqp_value);
        }
    }

    return result;
}